

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O2

Fl_Double_Window * make_declblock_panel(void)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Double_Window *this;
  Fl_Choice *this_00;
  Fl_Light_Button *pFVar5;
  Fl_Input *pFVar6;
  int iVar7;
  Fl_Window *this_01;
  Fl_Group *pFVar8;
  Fl_Widget *pFVar9;
  Fl_Group *pFVar10;
  Fl_Window *this_02;
  Fl_Button *this_03;
  
  this_01 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window
            ((Fl_Double_Window *)this_01,300,0x87,"Declaration Block Properties");
  declblock_panel = (Fl_Double_Window *)this_01;
  (this_01->super_Fl_Group).super_Fl_Widget.label_.size = 0xb;
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar8,10,10,0x118,0x14,(char *)0x0);
  pFVar9 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar9,10,10,0x8c,0x14,(char *)0x0);
  declblock_public_choice = (Fl_Choice *)pFVar9;
  Fl_Widget::tooltip(pFVar9,"Change widget accessibility.");
  this_00 = declblock_public_choice;
  (declblock_public_choice->super_Fl_Menu_).down_box_ = '\x0e';
  (this_00->super_Fl_Menu_).super_Fl_Widget.label_.size = 0xb;
  (this_00->super_Fl_Menu_).textsize_ = 0xb;
  (this_00->super_Fl_Menu_).super_Fl_Widget.when_ = '\0';
  Fl_Menu_::menu(&this_00->super_Fl_Menu_,menu_declblock_public_choice);
  pFVar9 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar9,10,10,0x3c,0x14,"public");
  declblock_public_button_x = (Fl_Light_Button *)pFVar9;
  Fl_Widget::tooltip(pFVar9,"Make the declaration publicly accessible.");
  pFVar5 = declblock_public_button_x;
  (declblock_public_button_x->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  (pFVar5->super_Fl_Button).super_Fl_Widget.when_ = '\0';
  (*(pFVar5->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
  pFVar9 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar9,0x9b,10,0x87,0x14,(char *)0x0);
  pFVar10 = Fl_Group::current();
  pFVar10->resizable_ = pFVar9;
  Fl_Group::end(pFVar8);
  pFVar9 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar9,10,0x28,0x118,0x14,(char *)0x0);
  decl_before_input = (Fl_Input *)pFVar9;
  Fl_Widget::tooltip(pFVar9,"#ifdef or similar conditional declaration block.");
  pFVar6 = decl_before_input;
  (decl_before_input->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar6->super_Fl_Input_).textfont_ = 4;
  (pFVar6->super_Fl_Input_).textsize_ = 0xb;
  (pFVar6->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar6->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar8 = Fl_Group::current();
  pFVar8->resizable_ = (Fl_Widget *)decl_before_input;
  pFVar9 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar9,10,0x4b,0x118,0x14,
                     "\"\\n...child code...\\n\" is inserted here");
  decl_after_input = (Fl_Input *)pFVar9;
  Fl_Widget::tooltip(pFVar9,"#endif or similar declaration code block.");
  pFVar6 = decl_after_input;
  (decl_after_input->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar6->super_Fl_Input_).textfont_ = 4;
  (pFVar6->super_Fl_Input_).textsize_ = 0xb;
  (pFVar6->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar6->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar8,10,0x69,0x118,0x14,(char *)0x0);
  pFVar9 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar9,0xa0,0x69,0x3c,0x14,"OK");
  declblock_panel_ok = (Fl_Return_Button *)pFVar9;
  (pFVar9->label_).size = 0xb;
  this_02 = Fl_Widget::window(pFVar9);
  Fl_Window::hotspot(this_02,(Fl_Widget *)declblock_panel_ok,0);
  this_03 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_03,0xe6,0x69,0x3c,0x14,"Cancel");
  declblock_panel_cancel = this_03;
  this_03->shortcut_ = 0xff1b;
  (this_03->super_Fl_Widget).label_.size = 0xb;
  pFVar9 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar9,10,0x69,0x8c,0x14,(char *)0x0);
  pFVar10 = Fl_Group::current();
  pFVar10->resizable_ = pFVar9;
  Fl_Group::end(pFVar8);
  iVar3 = (this_01->super_Fl_Group).super_Fl_Widget.w_;
  iVar4 = (this_01->super_Fl_Group).super_Fl_Widget.h_;
  iVar7 = Fl::w();
  iVar2 = (this_01->super_Fl_Group).super_Fl_Widget.h_;
  this_01->minw = iVar3;
  this_01->minh = iVar4;
  this_01->maxw = iVar7;
  this_01->maxh = iVar2;
  this_01->dw = 0;
  this_01->dh = 0;
  this_01->aspect = 0;
  Fl_Window::size_range_(this_01);
  this = declblock_panel;
  puVar1 = &(declblock_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end((Fl_Group *)this);
  return declblock_panel;
}

Assistant:

Fl_Double_Window* make_declblock_panel() {
  { Fl_Double_Window* o = declblock_panel = new Fl_Double_Window(300, 135, "Declaration Block Properties");
    declblock_panel->labelsize(11);
    { Fl_Group* o = new Fl_Group(10, 10, 280, 20);
      { declblock_public_choice = new Fl_Choice(10, 10, 140, 20);
        declblock_public_choice->tooltip("Change widget accessibility.");
        declblock_public_choice->down_box(FL_BORDER_BOX);
        declblock_public_choice->labelsize(11);
        declblock_public_choice->textsize(11);
        declblock_public_choice->when(FL_WHEN_NEVER);
        declblock_public_choice->menu(menu_declblock_public_choice);
      } // Fl_Choice* declblock_public_choice
      { declblock_public_button_x = new Fl_Light_Button(10, 10, 60, 20, "public");
        declblock_public_button_x->tooltip("Make the declaration publicly accessible.");
        declblock_public_button_x->labelsize(11);
        declblock_public_button_x->when(FL_WHEN_NEVER);
        declblock_public_button_x->hide();
      } // Fl_Light_Button* declblock_public_button_x
      { Fl_Box* o = new Fl_Box(155, 10, 135, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { decl_before_input = new Fl_Input(10, 40, 280, 20);
      decl_before_input->tooltip("#ifdef or similar conditional declaration block.");
      decl_before_input->labelsize(11);
      decl_before_input->textfont(4);
      decl_before_input->textsize(11);
      decl_before_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      decl_before_input->when(FL_WHEN_NEVER);
      Fl_Group::current()->resizable(decl_before_input);
    } // Fl_Input* decl_before_input
    { decl_after_input = new Fl_Input(10, 75, 280, 20, "\"\\n...child code...\\n\" is inserted here");
      decl_after_input->tooltip("#endif or similar declaration code block.");
      decl_after_input->labelsize(11);
      decl_after_input->textfont(4);
      decl_after_input->textsize(11);
      decl_after_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      decl_after_input->when(FL_WHEN_NEVER);
    } // Fl_Input* decl_after_input
    { Fl_Group* o = new Fl_Group(10, 105, 280, 20);
      { declblock_panel_ok = new Fl_Return_Button(160, 105, 60, 20, "OK");
        declblock_panel_ok->labelsize(11);
        declblock_panel_ok->window()->hotspot(declblock_panel_ok);
      } // Fl_Return_Button* declblock_panel_ok
      { declblock_panel_cancel = new Fl_Button(230, 105, 60, 20, "Cancel");
        declblock_panel_cancel->shortcut(0xff1b);
        declblock_panel_cancel->labelsize(11);
      } // Fl_Button* declblock_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 105, 140, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(o->w(), o->h(), Fl::w(), o->h());
    declblock_panel->set_modal();
    declblock_panel->end();
  } // Fl_Double_Window* declblock_panel
  return declblock_panel;
}